

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgproperty.cpp
# Opt level: O2

bool __thiscall lunasvg::SVGNumberPercentage::parse(SVGNumberPercentage *this,string_view input)

{
  bool bVar1;
  float fVar2;
  float value;
  float local_2c;
  string_view local_28;
  
  local_28._M_str = input._M_str;
  local_28._M_len = input._M_len;
  local_2c = 0.0;
  stripLeadingAndTrailingSpaces(&local_28);
  bVar1 = parseNumber<float>(&local_28,&local_2c);
  if ((bVar1) &&
     ((local_28._M_len == 0 ||
      ((*local_28._M_str == '%' && (local_2c = local_2c / 100.0, local_28._M_len == 1)))))) {
    fVar2 = 1.0;
    if (local_2c <= 1.0) {
      fVar2 = local_2c;
    }
    *(uint *)&(this->super_SVGProperty).field_0xc = ~-(uint)(local_2c < 0.0) & (uint)fVar2;
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SVGNumberPercentage::parse(std::string_view input)
{
    float value = 0.f;
    stripLeadingAndTrailingSpaces(input);
    if(!parseNumber(input, value))
        return false;
    if(!input.empty() && input.front() == '%') {
        value /= 100.f;
        input.remove_prefix(1);
    }

    if(!input.empty())
        return false;
    m_value = std::clamp(value, 0.f, 1.f);
    return true;
}